

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.h
# Opt level: O2

string * mdns::parsePacket(string *__return_storage_ptr__,string *data)

{
  byte bVar1;
  pointer pcVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  string hostname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar5 = data->_M_string_length;
  if (uVar5 < 0x10) {
    if (s_verbose) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Packet too small (");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," bytes)");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  else {
    pcVar2 = (data->_M_dataplus)._M_p;
    bVar6 = true;
    if ((pcVar2[6] != '\0') || (bVar6 = pcVar2[7] != '\0', s_verbose || bVar6)) {
      hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
      hostname._M_string_length = 0;
      hostname.field_2._M_local_buf[0] = '\0';
      uVar4 = 0xc;
      while (uVar4 + 2 < uVar5) {
        bVar1 = (data->_M_dataplus)._M_p[uVar4];
        uVar4 = uVar4 + 1;
        if (bVar1 == 0) break;
        uVar4 = (ulong)((int)uVar4 + (uint)bVar1 & 0xff);
        if (uVar5 <= uVar4) {
          if (s_verbose == true) {
            poVar3 = std::operator<<((ostream *)&std::cerr,
                                     " ! Invalid packet, next pos out of range (");
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3," max: ");
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3,")");
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_70);
          goto LAB_001068f2;
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)data);
        std::operator+(&local_70,&local_50,".");
        std::__cxx11::string::append((string *)&hostname);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        uVar5 = data->_M_string_length;
      }
      if ((s_verbose == true) && (uVar4 + 4 != uVar5)) {
        printf("Failed to parse entire packet (%lu/%lu), hostname: %s\n",uVar4,uVar5,
               hostname._M_dataplus._M_p);
      }
      if (bVar6) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)hostname._M_dataplus._M_p == &hostname.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(hostname.field_2._M_allocated_capacity._1_7_,
                        hostname.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = hostname.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = hostname._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(hostname.field_2._M_allocated_capacity._1_7_,
                        hostname.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = hostname._M_string_length;
        hostname._M_string_length = 0;
        hostname.field_2._M_local_buf[0] = '\0';
        hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
      }
      else {
        if (s_verbose == true) {
          std::operator+(&local_70,
                         " - Packet with no query response (probably another request) for ",
                         &hostname);
          puts(local_70._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_70);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_70);
      }
LAB_001068f2:
      std::__cxx11::string::~string((string *)&hostname);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&hostname);
  return __return_storage_ptr__;
}

Assistant:

std::string parsePacket(const std::string &data)
{
    constexpr size_t minSize = queryHeader.size() + 4; // idk
    if (data.size() < minSize) {
        if (s_verbose) std::cerr << "Packet too small (" << data.size() << " bytes)" << std::endl;
        return "";
    }

    const bool hasResponse = !(data[6] == 0 && data[7] == 0);
    if (!s_verbose && !hasResponse) { // if verbose mode is on, parse the name anyways
        return "";
    }

    std::string hostname;
    size_t pos = queryHeader.size();
    while (pos + 2 < data.size()) {
        const uint8_t length = data[pos];
        pos++;

        // Ends with a '.'
        if (length == 0) {
            break;
        }

        const uint8_t nextPos = pos + length;
        if (nextPos >= data.size()) {
            if (s_verbose) std::cerr << " ! Invalid packet, next pos out of range (" << size_t(nextPos) << " max: " << data.size() << ")" << std::endl;
            return "";
        }
        hostname += data.substr(pos, length) + ".";

        pos = nextPos;
    }

    if (s_verbose && pos + queryFooter.size() != data.size()) {
        printf("Failed to parse entire packet (%lu/%lu), hostname: %s\n", pos, data.size(), hostname.c_str());
    }
    // No answers in packet
    if (!hasResponse) {
        if (s_verbose) puts((" - Packet with no query response (probably another request) for " + hostname).c_str());
        return "";
    }

    return hostname;
}